

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

TestPartResultReporterInterface ** __thiscall
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
          (ThreadLocal<testing::TestPartResultReporterInterface_*> *this)

{
  int iVar1;
  undefined8 *__pointer;
  GTestLog local_1c;
  
  __pointer = (undefined8 *)pthread_getspecific(this->key_);
  if (__pointer == (undefined8 *)0x0) {
    __pointer = (undefined8 *)operator_new(0x10);
    if (__pointer != (undefined8 *)0x0) {
      *__pointer = &PTR__ThreadLocalValueHolderBase_001d5d48;
      __pointer[1] = this->default_;
    }
    iVar1 = pthread_setspecific(this->key_,__pointer);
    if (iVar1 != 0) {
      GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/googletest/gtest/gtest.h"
                         ,0xa50);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"pthread_setspecific(key_, holder_base)",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"failed with error ",0x12);
      std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      GTestLog::~GTestLog(&local_1c);
    }
  }
  return (TestPartResultReporterInterface **)(__pointer + 1);
}

Assistant:

T* GetOrCreateValue() const {
                ThreadLocalValueHolderBase* const holder =
                    static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
                if (holder != NULL) {
                    return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
                }

                ValueHolder* const new_holder = new ValueHolder(default_);
                ThreadLocalValueHolderBase* const holder_base = new_holder;
                GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
                return new_holder->pointer();
            }